

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSources::ProcessRTPPacket
          (RTPSources *this,RTPPacket *rtppack,RTPTime *receivetime,RTPAddress *senderaddress,
          bool *stored)

{
  bool bVar1;
  bool bVar2;
  RTPInternalSourceData *pRVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  ulong uVar7;
  int i;
  uint uVar8;
  ulong uVar9;
  bool createdcsrc;
  bool created;
  bool *local_98;
  RTPAddress *local_90;
  RTPInternalSourceData *csrcdat;
  RTPInternalSourceData *srcdat;
  uint32_t CSRCs [15];
  
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[2])();
  *stored = false;
  iVar5 = ObtainSourceDataInstance(this,rtppack->ssrc,&srcdat,&created);
  if (-1 < iVar5) {
    local_98 = stored;
    if (created == true) {
      iVar5 = RTPInternalSourceData::SetRTPDataAddress(srcdat,senderaddress);
      if (iVar5 < 0) {
        return iVar5;
      }
    }
    else {
      bVar4 = CheckCollision(this,srcdat,senderaddress,true);
      if (bVar4) {
        return 0;
      }
    }
    bVar4 = (srcdat->super_RTPSourceData).issender;
    bVar1 = (srcdat->super_RTPSourceData).receivedbye;
    bVar2 = (srcdat->super_RTPSourceData).validated;
    uVar8 = 0xf;
    if (rtppack->numcsrcs < 0xf) {
      uVar8 = rtppack->numcsrcs;
    }
    uVar7 = 0;
    uVar9 = (ulong)uVar8;
    local_90 = senderaddress;
    if ((int)uVar8 < 1) {
      uVar9 = uVar7;
    }
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      uVar6 = RTPPacket::GetCSRC(rtppack,(int)uVar7);
      CSRCs[uVar7] = uVar6;
    }
    iVar5 = RTPInternalSourceData::ProcessRTPPacket(srcdat,rtppack,receivetime,local_98,this);
    if (-1 < iVar5) {
      if ((bVar4 == false) && ((srcdat->super_RTPSourceData).issender == true)) {
        this->sendercount = this->sendercount + 1;
      }
      if ((((bVar2 == false) || ((bVar1 & 1U) != 0)) &&
          ((srcdat->super_RTPSourceData).validated == true)) &&
         (((srcdat->super_RTPSourceData).receivedbye & 1U) == 0)) {
        this->activecount = this->activecount + 1;
      }
      if (created != false) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,srcdat);
      }
      iVar5 = 0;
      if ((srcdat->super_RTPSourceData).validated == true) {
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          iVar5 = ObtainSourceDataInstance(this,CSRCs[uVar7],&csrcdat,&createdcsrc);
          pRVar3 = csrcdat;
          if (iVar5 < 0) {
            return iVar5;
          }
          if (createdcsrc == true) {
            (csrcdat->super_RTPSourceData).validated = true;
            (csrcdat->super_RTPSourceData).iscsrc = true;
            if (((csrcdat->super_RTPSourceData).receivedbye & 1U) == 0) {
              this->activecount = this->activecount + 1;
            }
            (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,csrcdat);
          }
          else {
            bVar4 = CheckCollision(this,csrcdat,local_90,true);
            if (!bVar4) {
              (pRVar3->super_RTPSourceData).validated = true;
              (pRVar3->super_RTPSourceData).iscsrc = true;
            }
          }
        }
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int RTPSources::ProcessRTPPacket(RTPPacket *rtppack,const RTPTime &receivetime,const RTPAddress *senderaddress,bool *stored)
{
	uint32_t ssrc;
	RTPInternalSourceData *srcdat;
	int status;
	bool created;

	OnRTPPacket(rtppack,receivetime,senderaddress);

	*stored = false;
	
	ssrc = rtppack->GetSSRC();
	if ((status = ObtainSourceDataInstance(ssrc,&srcdat,&created)) < 0)
		return status;

	if (created)
	{
		if ((status = srcdat->SetRTPDataAddress(senderaddress)) < 0)
			return status;
	}
	else // got a previously existing source
	{
		if (CheckCollision(srcdat,senderaddress,true))
			return 0; // ignore packet on collision
	}
	
	bool prevsender = srcdat->IsSender();
	bool prevactive = srcdat->IsActive();
	
	uint32_t CSRCs[RTP_MAXCSRCS];
	int numCSRCs = rtppack->GetCSRCCount();
	if (numCSRCs > RTP_MAXCSRCS) // shouldn't happen, but better to check than go out of bounds
		numCSRCs = RTP_MAXCSRCS;

	for (int i = 0 ; i < numCSRCs ; i++)
		CSRCs[i] = rtppack->GetCSRC(i);

	// The packet comes from a valid source, we can process it further now
	// The following function should delete rtppack itself if something goes
	// wrong
	if ((status = srcdat->ProcessRTPPacket(rtppack,receivetime,stored,this)) < 0)
		return status;

	// NOTE: we cannot use 'rtppack' anymore since it may have been deleted in
	//       OnValidatedRTPPacket

	if (!prevsender && srcdat->IsSender())
		sendercount++;
	if (!prevactive && srcdat->IsActive())
		activecount++;

	if (created)
		OnNewSource(srcdat);

	if (srcdat->IsValidated()) // process the CSRCs
	{
		RTPInternalSourceData *csrcdat;
		bool createdcsrc;

		int num = numCSRCs;
		int i;

		for (i = 0 ; i < num ; i++)
		{
			if ((status = ObtainSourceDataInstance(CSRCs[i],&csrcdat,&createdcsrc)) < 0)
				return status;
			if (createdcsrc)
			{
				csrcdat->SetCSRC();
				if (csrcdat->IsActive())
					activecount++;
				OnNewSource(csrcdat);
			}
			else // already found an entry, possibly because of RTCP data
			{
				if (!CheckCollision(csrcdat,senderaddress,true))
					csrcdat->SetCSRC();
			}
		}
	}
	
	return 0;
}